

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOService.cpp
# Opt level: O3

void anon_unknown.dwarf_62f9fb::init_curious_service(Caliper *c,Channel *channel)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Events *pEVar2;
  ostream *poVar3;
  Attribute subscribe_attr;
  Variant v_true;
  undefined8 local_298;
  string local_290;
  undefined8 local_270;
  undefined8 local_268;
  value_type local_260;
  value_type local_240;
  undefined1 local_220 [16];
  long local_210 [29];
  ios_base local_128 [264];
  int local_20;
  
  local_220._0_8_ = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"subscription_event","");
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[2])
                    (c,local_220);
  local_298 = CONCAT44(extraout_var,iVar1);
  if ((long *)local_220._0_8_ != local_210) {
    operator_delete((void *)local_220._0_8_,local_210[0] + 1);
  }
  local_270 = 7;
  local_268 = 1;
  local_220._0_8_ = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"io.region","");
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_220,4,0x14,1,&local_298,&local_270);
  (anonymous_namespace)::io_region_attr = CONCAT44(extraout_var_00,iVar1);
  if ((long *)local_220._0_8_ != local_210) {
    operator_delete((void *)local_220._0_8_,local_210[0] + 1);
  }
  local_220._0_8_ = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"io.filesystem","");
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_220,4,0x54,0,0,0);
  (anonymous_namespace)::io_filesystem_attr = CONCAT44(extraout_var_01,iVar1);
  if ((long *)local_220._0_8_ != local_210) {
    operator_delete((void *)local_220._0_8_,local_210[0] + 1);
  }
  local_220._0_8_ = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"io.mount.point","");
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_220,4,0x54,0,0,0);
  (anonymous_namespace)::io_mount_point_attr = CONCAT44(extraout_var_02,iVar1);
  if ((long *)local_220._0_8_ != local_210) {
    operator_delete((void *)local_220._0_8_,local_210[0] + 1);
  }
  local_220._0_8_ = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"io.bytes.read","");
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_220,3,0x815,0,0,0);
  _ZN12_GLOBAL__N_118io_bytes_read_attrE_0 = CONCAT44(extraout_var_03,iVar1);
  if ((long *)local_220._0_8_ != local_210) {
    operator_delete((void *)local_220._0_8_,local_210[0] + 1);
  }
  local_220._0_8_ = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"io.bytes.written","");
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_220,3,0x815,0,0,0);
  _ZN12_GLOBAL__N_121io_bytes_written_attrE_0 = CONCAT44(extraout_var_04,iVar1);
  if ((long *)local_220._0_8_ != local_210) {
    operator_delete((void *)local_220._0_8_,local_210[0] + 1);
  }
  pEVar2 = cali::Channel::events(channel);
  local_240.super__Function_base._M_functor._8_8_ = 0;
  local_240.super__Function_base._M_functor._M_unused._M_object = init_curious_in_channel;
  local_240._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_invoke;
  local_240.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar2->post_init_evt).mCb,&local_240);
  if (local_240.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_240.super__Function_base._M_manager)
              ((_Any_data *)&local_240,(_Any_data *)&local_240,__destroy_functor);
  }
  pEVar2 = cali::Channel::events(channel);
  local_260.super__Function_base._M_functor._8_8_ = 0;
  local_260.super__Function_base._M_functor._M_unused._M_object = finalize_curious_in_channel;
  local_260._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_invoke;
  local_260.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar2->pre_finish_evt).mCb,&local_260);
  if (local_260.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_260.super__Function_base._M_manager)
              ((_Any_data *)&local_260,(_Any_data *)&local_260,__destroy_functor);
  }
  poVar3 = (ostream *)local_220;
  std::ofstream::ofstream(poVar3);
  local_20 = 1;
  iVar1 = cali::Log::verbosity();
  if (local_20 <= iVar1) {
    poVar3 = cali::Log::get_stream((Log *)local_220);
  }
  cali::Channel::name_abi_cxx11_(&local_290,channel);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": Registered io service",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  local_220._0_8_ = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)(local_220 + 8));
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void init_curious_service(Caliper* c, Channel* channel)
{
    Attribute subscribe_attr = c->get_attribute("subscription_event");
    Variant   v_true(true);

    // create I/O attributes
    io_region_attr =
        c->create_attribute("io.region", CALI_TYPE_STRING, CALI_ATTR_SCOPE_THREAD, 1, &subscribe_attr, &v_true);
    io_filesystem_attr =
        c->create_attribute("io.filesystem", CALI_TYPE_STRING, CALI_ATTR_SCOPE_THREAD | CALI_ATTR_SKIP_EVENTS);
    io_mount_point_attr =
        c->create_attribute("io.mount.point", CALI_TYPE_STRING, CALI_ATTR_SCOPE_THREAD | CALI_ATTR_SKIP_EVENTS);

    io_bytes_read_attr = c->create_attribute(
        "io.bytes.read",
        CALI_TYPE_UINT,
        CALI_ATTR_SCOPE_THREAD | CALI_ATTR_ASVALUE | CALI_ATTR_AGGREGATABLE
    );
    io_bytes_written_attr = c->create_attribute(
        "io.bytes.written",
        CALI_TYPE_UINT,
        CALI_ATTR_SCOPE_THREAD | CALI_ATTR_ASVALUE | CALI_ATTR_AGGREGATABLE
    );

    // register Caliper post_init_evt and finish_evt callbacks
    channel->events().post_init_evt.connect(init_curious_in_channel);

    // finish_evt: unregister channel from curious (??)
    channel->events().pre_finish_evt.connect(finalize_curious_in_channel);

    Log(1).stream() << channel->name() << ": Registered io service" << std::endl;
}